

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O2

void __thiscall CGameControllerCTF::Snap(CGameControllerCTF *this,int SnappingClient)

{
  IServer *pIVar1;
  CFlag *pCVar2;
  CPlayer *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  int *piVar5;
  
  IGameController::Snap(&this->super_IGameController,SnappingClient);
  pIVar1 = (this->super_IGameController).m_pServer;
  iVar4 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])(pIVar1,8,0,0x10);
  piVar5 = (int *)CONCAT44(extraout_var,iVar4);
  if (piVar5 != (int *)0x0) {
    piVar5[2] = 0;
    pCVar2 = this->m_apFlags[0];
    if (pCVar2 == (CFlag *)0x0) {
      *piVar5 = -3;
    }
    else if (pCVar2->m_AtStand == true) {
      *piVar5 = -2;
    }
    else if ((pCVar2->m_pCarrier == (CCharacter *)0x0) ||
            (pCVar3 = pCVar2->m_pCarrier->m_pPlayer, pCVar3 == (CPlayer *)0x0)) {
      *piVar5 = -1;
      piVar5[2] = pCVar2->m_DropTick;
    }
    else {
      *piVar5 = pCVar3->m_ClientID;
    }
    piVar5[3] = 0;
    pCVar2 = this->m_apFlags[1];
    if (pCVar2 == (CFlag *)0x0) {
      piVar5[1] = -3;
    }
    else if (pCVar2->m_AtStand == true) {
      piVar5[1] = -2;
    }
    else if ((pCVar2->m_pCarrier == (CCharacter *)0x0) ||
            (pCVar3 = pCVar2->m_pCarrier->m_pPlayer, pCVar3 == (CPlayer *)0x0)) {
      piVar5[1] = -1;
      piVar5[3] = pCVar2->m_DropTick;
    }
    else {
      piVar5[1] = pCVar3->m_ClientID;
    }
  }
  return;
}

Assistant:

void CGameControllerCTF::Snap(int SnappingClient)
{
	IGameController::Snap(SnappingClient);

	CNetObj_GameDataFlag *pGameDataFlag = static_cast<CNetObj_GameDataFlag *>(Server()->SnapNewItem(NETOBJTYPE_GAMEDATAFLAG, 0, sizeof(CNetObj_GameDataFlag)));
	if(!pGameDataFlag)
		return;

	pGameDataFlag->m_FlagDropTickRed = 0;
	if(m_apFlags[TEAM_RED])
	{
		if(m_apFlags[TEAM_RED]->IsAtStand())
			pGameDataFlag->m_FlagCarrierRed = FLAG_ATSTAND;
		else if(m_apFlags[TEAM_RED]->GetCarrier() && m_apFlags[TEAM_RED]->GetCarrier()->GetPlayer())
			pGameDataFlag->m_FlagCarrierRed = m_apFlags[TEAM_RED]->GetCarrier()->GetPlayer()->GetCID();
		else
		{
			pGameDataFlag->m_FlagCarrierRed = FLAG_TAKEN;
			pGameDataFlag->m_FlagDropTickRed = m_apFlags[TEAM_RED]->GetDropTick();
		}
	}
	else
		pGameDataFlag->m_FlagCarrierRed = FLAG_MISSING;
	pGameDataFlag->m_FlagDropTickBlue = 0;
	if(m_apFlags[TEAM_BLUE])
	{
		if(m_apFlags[TEAM_BLUE]->IsAtStand())
			pGameDataFlag->m_FlagCarrierBlue = FLAG_ATSTAND;
		else if(m_apFlags[TEAM_BLUE]->GetCarrier() && m_apFlags[TEAM_BLUE]->GetCarrier()->GetPlayer())
			pGameDataFlag->m_FlagCarrierBlue = m_apFlags[TEAM_BLUE]->GetCarrier()->GetPlayer()->GetCID();
		else
		{
			pGameDataFlag->m_FlagCarrierBlue = FLAG_TAKEN;
			pGameDataFlag->m_FlagDropTickBlue = m_apFlags[TEAM_BLUE]->GetDropTick();
		}
	}
	else
		pGameDataFlag->m_FlagCarrierBlue = FLAG_MISSING;
}